

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_file_header(j_compress_ptr cinfo)

{
  long in_RDI;
  my_marker_ptr marker;
  JPEG_MARKER in_stack_ffffffffffffffec;
  j_compress_ptr cinfo_00;
  
  cinfo_00 = *(j_compress_ptr *)(in_RDI + 0x210);
  emit_marker(cinfo_00,in_stack_ffffffffffffffec);
  cinfo_00->input_components = 0;
  if (*(int *)(in_RDI + 0x144) != 0) {
    emit_jfif_app0((j_compress_ptr)0x287c0d);
  }
  if (*(int *)(in_RDI + 0x150) != 0) {
    emit_adobe_app14(cinfo_00);
  }
  return;
}

Assistant:

METHODDEF(void)
write_file_header (j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;

  emit_marker(cinfo, M_SOI);	/* first the SOI */

  /* SOI is defined to reset restart interval to 0 */
  marker->last_restart_interval = 0;

  if (cinfo->write_JFIF_header)	/* next an optional JFIF APP0 */
    emit_jfif_app0(cinfo);
  if (cinfo->write_Adobe_marker) /* next an optional Adobe APP14 */
    emit_adobe_app14(cinfo);
}